

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-map.c
# Opt level: O2

void grid_data_as_text(grid_data *g,int *ap,wchar_t *cp,int *tap,wchar_t *tcp)

{
  grid_light_level gVar1;
  wchar_t wVar2;
  ulong uVar3;
  int n;
  _Bool _Var4;
  byte bVar5;
  byte bVar6;
  uint uVar7;
  wchar_t wVar8;
  uint32_t uVar9;
  monster *pmVar10;
  ulong uVar11;
  int attr;
  trap *ptVar12;
  object_kind *poVar13;
  monster_race *pmVar14;
  uint uVar15;
  object_kind **ppoVar16;
  
  bVar6 = feat_x_attr[g->lighting][f_info[g->f_idx].fidx];
  uVar15 = (uint)bVar6;
  wVar8 = feat_x_char[g->lighting][f_info[g->f_idx].fidx];
  if (use_graphics == L'\0') {
    uVar15 = bVar6 & 0x7f;
    _Var4 = feat_is_torch(g->f_idx);
    if (_Var4) {
      gVar1 = g->lighting;
      if (gVar1 == LIGHTING_DARK) {
        attr = 5;
        n = 2;
      }
      else {
        if (gVar1 == LIGHTING_LIT) {
          attr = 5;
        }
        else {
          if ((gVar1 != LIGHTING_TORCH) || (_Var4 = outside(), _Var4)) goto LAB_001e3805;
          attr = 4;
        }
        n = 1;
      }
      bVar5 = get_color((uint8_t)uVar15,attr,n);
      uVar15 = (uint)bVar5;
    }
LAB_001e3805:
    uVar15 = bVar6 & 0xffffff80 | uVar15;
    if (((use_graphics == L'\0') && (_Var4 = feat_is_wall(g->f_idx), _Var4)) &&
       ((uVar7 = 0x200, (player->opts).opt[0xc] != false ||
        (uVar7 = 0x100, (player->opts).opt[0xb] == true)))) {
      uVar15 = uVar15 | uVar7;
    }
  }
  *tap = uVar15;
  *tcp = wVar8;
  if ((g->trap != (trap *)0x0) && (g->hallucinate == false)) {
    _Var4 = flag_has_dbg(g->trap->flags,3,3,"g->trap->flags","TRF_VISIBLE");
    if ((_Var4) ||
       (((_Var4 = flag_has_dbg(g->trap->flags,3,1,"g->trap->flags","TRF_GLYPH"), _Var4 ||
         (_Var4 = flag_has_dbg(g->trap->flags,3,0x10,"g->trap->flags","TRF_M_TRAP"), _Var4)) ||
        (_Var4 = flag_has_dbg(g->trap->flags,3,0xf,"g->trap->flags","TRF_WEB"), _Var4)))) {
      ptVar12 = g->trap;
      wVar8 = ptVar12->kind->tidx;
      uVar15 = (uint)trap_x_attr[g->lighting][wVar8];
      wVar8 = trap_x_char[g->lighting][wVar8];
    }
    else {
      ptVar12 = g->trap;
    }
    _Var4 = flag_has_dbg(ptVar12->flags,3,0xf,"g->trap->flags","TRF_WEB");
    if (!_Var4) goto LAB_001e394e;
    goto LAB_001e3985;
  }
LAB_001e394e:
  if (g->unseen_money == true) {
    ppoVar16 = &unknown_gold_kind;
LAB_001e3970:
    bVar6 = object_kind_attr(*ppoVar16);
    poVar13 = *ppoVar16;
LAB_001e397e:
    uVar15 = (uint)bVar6;
    wVar8 = object_kind_char(poVar13);
  }
  else {
    if (g->unseen_object == true) {
      ppoVar16 = &unknown_item_kind;
      goto LAB_001e3970;
    }
    if (g->first_kind != (object_kind *)0x0) {
      if (g->hallucinate == true) {
        do {
          do {
            poVar13 = k_info;
            uVar9 = Rand_div(z_info->k_max - 1);
          } while (poVar13[(long)(int)uVar9 + 1].name == (char *)0x0);
          uVar7 = poVar13[(long)(int)uVar9 + 1].kidx;
          uVar15 = (uint)kind_x_attr[uVar7];
          wVar8 = kind_x_char[uVar7];
        } while (wVar8 == L'\0' || kind_x_attr[uVar7] == 0);
        goto LAB_001e3985;
      }
      if (g->multiple_objects == true) {
        ppoVar16 = &pile_kind;
        goto LAB_001e3970;
      }
      bVar6 = object_kind_attr(g->first_kind);
      poVar13 = g->first_kind;
      goto LAB_001e397e;
    }
  }
LAB_001e3985:
  if (g->m_idx == L'\0') {
    if (g->is_player != true) goto LAB_001e3c06;
    uVar11 = (ulong)r_info->ridx;
    uVar15 = (uint)monster_x_attr[uVar11];
    if (((player->opts).opt[0x12] == true) && (-1 < (char)monster_x_attr[uVar11])) {
      uVar3 = (long)(player->chp * 10) / (long)(int)player->mhp;
      if ((uint)uVar3 < 9) {
        uVar15 = *(uint *)(&DAT_0022f1d4 + (uVar3 & 0xffffffff) * 4);
      }
      else {
        uVar15 = 1;
      }
    }
  }
  else {
    if (g->hallucinate != true) {
      pmVar10 = cave_monster(cave,g->m_idx);
      _Var4 = monster_is_camouflaged(pmVar10);
      if (_Var4) goto LAB_001e3c06;
      pmVar10 = cave_monster(cave,g->m_idx);
      pmVar14 = pmVar10->race;
      bVar6 = monster_x_attr[pmVar14->ridx];
      uVar7 = (uint)bVar6;
      wVar2 = monster_x_char[pmVar14->ridx];
      if (-1 < (char)bVar6) {
        if ((player->opts).opt[0x10] == true) {
          _Var4 = monster_is_shape_unique(pmVar10);
          if (_Var4) {
            uVar7 = 0x11;
            goto LAB_001e3bfc;
          }
          pmVar14 = pmVar10->race;
        }
        _Var4 = flag_has_dbg(pmVar14->flags,0xc,10,"mon->race->flags","RF_ATTR_MULTI");
        if (((_Var4) ||
            (_Var4 = flag_has_dbg(pmVar10->race->flags,0xc,0xb,"mon->race->flags","RF_ATTR_FLICKER")
            , _Var4)) ||
           (_Var4 = flag_has_dbg(pmVar10->race->flags,0xc,8,"mon->race->flags","RF_ATTR_RAND"),
           _Var4)) {
          uVar7 = (uint)bVar6;
          if (pmVar10->attr != 0) {
            uVar7 = (uint)pmVar10->attr;
          }
        }
        else {
          _Var4 = flags_test(pmVar10->race->flags,0xc,9,7,0);
          if (_Var4) {
            if (((-1 < (char)uVar15) &&
                (_Var4 = flag_has_dbg(pmVar10->race->flags,0xc,7,"mon->race->flags","RF_CHAR_CLEAR")
                , uVar7 = uVar15, _Var4)) &&
               (_Var4 = flag_has_dbg(pmVar10->race->flags,0xc,9,"mon->race->flags","RF_ATTR_CLEAR"),
               wVar2 = wVar8, uVar7 = (uint)bVar6, _Var4)) {
              uVar7 = uVar15;
            }
          }
          else {
            wVar2 = monster_x_char[pmVar10->race->ridx];
          }
        }
      }
LAB_001e3bfc:
      wVar8 = wVar2;
      pmVar10->attr = (uint8_t)uVar7;
      uVar15 = uVar7;
      goto LAB_001e3c06;
    }
    do {
      pmVar14 = r_info;
      uVar9 = Rand_div((uint)z_info->r_max);
    } while (pmVar14[(int)uVar9].name == (char *)0x0);
    uVar11 = (ulong)pmVar14[(int)uVar9].ridx;
    uVar15 = (uint)monster_x_attr[uVar11];
  }
  wVar8 = monster_x_char[uVar11];
LAB_001e3c06:
  *ap = uVar15;
  *cp = wVar8;
  return;
}

Assistant:

void grid_data_as_text(struct grid_data *g, int *ap, wchar_t *cp, int *tap,
					   wchar_t *tcp)
{
	struct feature *feat = &f_info[g->f_idx];

	int a = feat_x_attr[g->lighting][feat->fidx];
	wchar_t c = feat_x_char[g->lighting][feat->fidx];
	bool skip_objects = false;

	/* Get the colour for ASCII */
	if (use_graphics == GRAPHICS_NONE)
		grid_get_attr(g, &a);

	/* Save the terrain info for the transparency effects */
	(*tap) = a;
	(*tcp) = c;

	/* There is a trap in this grid, and we are not hallucinating */
	if (g->trap && (!g->hallucinate)) {
	    /* Change graphics to indicate visible traps, skip objects if a web */
	    skip_objects = get_trap_graphics(cave, g, &a, &c);
	}

	if (!skip_objects) {
		/* If there's an object, deal with that. */
		if (g->unseen_money) {

			/* $$$ gets an orange star*/
			a = object_kind_attr(unknown_gold_kind);
			c = object_kind_char(unknown_gold_kind);

		} else if (g->unseen_object) {

			/* Everything else gets a red star */
			a = object_kind_attr(unknown_item_kind);
			c = object_kind_char(unknown_item_kind);

		} else if (g->first_kind) {
			if (g->hallucinate) {
				/* Just pick a random object to display. */
				hallucinatory_object(&a, &c);
			} else if (g->multiple_objects) {
				/* Get the "pile" feature instead */
				a = object_kind_attr(pile_kind);
				c = object_kind_char(pile_kind);
			} else {
				/* Normal attr and char */
				a = object_kind_attr(g->first_kind);
				c = object_kind_char(g->first_kind);
			}
		}
	}

	/* Handle monsters, the player and trap borders */
	if (g->m_idx > 0) {
		if (g->hallucinate) {
			/* Just pick a random monster to display. */
			hallucinatory_monster(&a, &c);
		} else if (!monster_is_camouflaged(cave_monster(cave, g->m_idx)))	{
			struct monster *mon = cave_monster(cave, g->m_idx);

			uint8_t da;
			wchar_t dc;

			/* Desired attr & char */
			da = monster_x_attr[mon->race->ridx];
			dc = monster_x_char[mon->race->ridx];

			/* Special handling of attrs and/or chars */
			if (da & 0x80) {
				/* Special attr/char codes */
				a = da;
				c = dc;
			} else if (OPT(player, purple_uniques) && 
					monster_is_shape_unique(mon)) {
				/* Turn uniques purple if desired (violet, actually) */
				a = COLOUR_VIOLET;
				c = dc;
			} else if (rf_has(mon->race->flags, RF_ATTR_MULTI) ||
					   rf_has(mon->race->flags, RF_ATTR_FLICKER) ||
					   rf_has(mon->race->flags, RF_ATTR_RAND)) {
				/* Multi-hued monster */
				a = mon->attr ? mon->attr : da;
				c = dc;
			} else if (!flags_test(mon->race->flags, RF_SIZE,
								   RF_ATTR_CLEAR, RF_CHAR_CLEAR, FLAG_END)) {
				/* Normal monster (not "clear" in any way) */
				a = da;
				/* Desired attr & char. da is not used, should a be set to it?*/
				/*da = monster_x_attr[mon->race->ridx];*/
				dc = monster_x_char[mon->race->ridx];
				c = dc;
			} else if (a & 0x80) {
				/* Hack -- Bizarre grid under monster */
				a = da;
				c = dc;
			} else if (!rf_has(mon->race->flags, RF_CHAR_CLEAR)) {
				/* Normal char, Clear attr, monster */
				c = dc;
			} else if (!rf_has(mon->race->flags, RF_ATTR_CLEAR)) {
				/* Normal attr, Clear char, monster */
				a = da;
			}

			/* Store the drawing attr so we can use it elsewhere */
			mon->attr = a;
		}
	} else if (g->is_player) {
		struct monster_race *race = &r_info[0];

		/* Get the "player" attr */
		a = monster_x_attr[race->ridx];
		if ((OPT(player, hp_changes_color)) && !(a & 0x80)) {
			switch(player->chp * 10 / player->mhp)
			{
			case 10:
			case  9: 
			{
				a = COLOUR_WHITE; 
				break;
			}
			case  8:
			case  7:
			{
				a = COLOUR_YELLOW;
				break;
			}
			case  6:
			case  5:
			{
				a = COLOUR_ORANGE;
				break;
			}
			case  4:
			case  3:
			{
				a = COLOUR_L_RED;
				break;
			}
			case  2:
			case  1:
			case  0:
			{
				a = COLOUR_RED;
				break;
			}
			default:
			{
				a = COLOUR_WHITE;
				break;
			}
			}
		}

		/* Get the "player" char */
		c = monster_x_char[race->ridx];
	}

	/* Result */
	(*ap) = a;
	(*cp) = c;
}